

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int blobSeekToRow(Incrblob *p,sqlite3_int64 iRow,char **pzErr)

{
  uint serial_type;
  sqlite3_stmt *psVar1;
  sqlite3 *db;
  u32 uVar2;
  char *pcVar3;
  char *local_50;
  u32 type;
  Vdbe *v;
  char *zErr;
  int rc;
  char **pzErr_local;
  sqlite3_int64 iRow_local;
  Incrblob *p_local;
  
  v = (Vdbe *)0x0;
  psVar1 = p->pStmt;
  *(sqlite3_int64 *)(*(long *)(psVar1 + 0x78) + 0x18) = iRow;
  zErr._4_4_ = sqlite3_step(p->pStmt);
  if (zErr._4_4_ == 100) {
    serial_type = *(uint *)(*(long *)(**(long **)(psVar1 + 0x70) + 0x70) + (long)p->iCol * 4);
    if (serial_type < 0xc) {
      if (serial_type == 0) {
        local_50 = "null";
      }
      else {
        local_50 = "integer";
        if (serial_type == 7) {
          local_50 = "real";
        }
      }
      v = (Vdbe *)sqlite3MPrintf(p->db,"cannot open value of type %s",local_50);
      zErr._4_4_ = 1;
      sqlite3_finalize(p->pStmt);
      p->pStmt = (sqlite3_stmt *)0x0;
    }
    else {
      p->iOffset = *(int *)(*(long *)(**(long **)(psVar1 + 0x70) + 0x78) + (long)p->iCol * 4);
      uVar2 = sqlite3VdbeSerialTypeLen(serial_type);
      p->nByte = uVar2;
      p->pCsr = *(BtCursor **)**(undefined8 **)(psVar1 + 0x70);
      sqlite3BtreeEnterCursor(p->pCsr);
      sqlite3BtreeCacheOverflow(p->pCsr);
      sqlite3BtreeLeaveCursor(p->pCsr);
    }
  }
  if (zErr._4_4_ == 100) {
    zErr._4_4_ = 0;
  }
  else if (p->pStmt != (sqlite3_stmt *)0x0) {
    zErr._4_4_ = sqlite3_finalize(p->pStmt);
    p->pStmt = (sqlite3_stmt *)0x0;
    if (zErr._4_4_ == 0) {
      v = (Vdbe *)sqlite3MPrintf(p->db,"no such rowid: %lld",iRow);
      zErr._4_4_ = 1;
    }
    else {
      db = p->db;
      pcVar3 = sqlite3_errmsg(p->db);
      v = (Vdbe *)sqlite3MPrintf(db,"%s",pcVar3);
    }
  }
  *pzErr = (char *)v;
  return zErr._4_4_;
}

Assistant:

static int blobSeekToRow(Incrblob *p, sqlite3_int64 iRow, char **pzErr){
  int rc;                         /* Error code */
  char *zErr = 0;                 /* Error message */
  Vdbe *v = (Vdbe *)p->pStmt;

  /* Set the value of the SQL statements only variable to integer iRow. 
  ** This is done directly instead of using sqlite3_bind_int64() to avoid 
  ** triggering asserts related to mutexes.
  */
  assert( v->aVar[0].flags&MEM_Int );
  v->aVar[0].u.i = iRow;

  rc = sqlite3_step(p->pStmt);
  if( rc==SQLITE_ROW ){
    u32 type = v->apCsr[0]->aType[p->iCol];
    if( type<12 ){
      zErr = sqlite3MPrintf(p->db, "cannot open value of type %s",
          type==0?"null": type==7?"real": "integer"
      );
      rc = SQLITE_ERROR;
      sqlite3_finalize(p->pStmt);
      p->pStmt = 0;
    }else{
      p->iOffset = v->apCsr[0]->aOffset[p->iCol];
      p->nByte = sqlite3VdbeSerialTypeLen(type);
      p->pCsr =  v->apCsr[0]->pCursor;
      sqlite3BtreeEnterCursor(p->pCsr);
      sqlite3BtreeCacheOverflow(p->pCsr);
      sqlite3BtreeLeaveCursor(p->pCsr);
    }
  }

  if( rc==SQLITE_ROW ){
    rc = SQLITE_OK;
  }else if( p->pStmt ){
    rc = sqlite3_finalize(p->pStmt);
    p->pStmt = 0;
    if( rc==SQLITE_OK ){
      zErr = sqlite3MPrintf(p->db, "no such rowid: %lld", iRow);
      rc = SQLITE_ERROR;
    }else{
      zErr = sqlite3MPrintf(p->db, "%s", sqlite3_errmsg(p->db));
    }
  }

  assert( rc!=SQLITE_OK || zErr==0 );
  assert( rc!=SQLITE_ROW && rc!=SQLITE_DONE );

  *pzErr = zErr;
  return rc;
}